

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

DecodeStatus DecodeGPR32spRegisterClass(MCInst *Inst,uint RegNo,uint64_t Addr,void *Decoder)

{
  DecodeStatus in_EAX;
  DecodeStatus extraout_EAX;
  DecodeStatus extraout_EAX_00;
  
  if (0x1f < RegNo) {
    return in_EAX;
  }
  if (RegNo != 0x1f) {
    MCOperand_CreateReg0(Inst,GPR32DecoderTable[RegNo]);
    return extraout_EAX;
  }
  MCOperand_CreateReg0(Inst,5);
  return extraout_EAX_00;
}

Assistant:

static DecodeStatus DecodeGPR32spRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Register;

	if (RegNo > 31)
		return Fail;

	Register = GPR32DecoderTable[RegNo];
	if (Register == AArch64_WZR)
		Register = AArch64_WSP;

	MCOperand_CreateReg0(Inst, Register);
	return Success;
}